

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O1

char * raccess_make_file_name(FT_Memory memory,char *original_name,char *insertion)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  size_t __n;
  bool bVar5;
  
  sVar1 = strlen(original_name);
  sVar2 = strlen(insertion);
  __n = sVar1 + sVar2 + 1;
  if (sVar2 + sVar1 < 0x7fffffffffffffff) {
    pcVar3 = (char *)(*memory->alloc)(memory,__n);
    bVar5 = pcVar3 != (char *)0x0;
  }
  else {
    bVar5 = __n == 0;
    pcVar3 = (char *)0x0;
  }
  if (!(bool)(bVar5 ^ 1U | 0x7ffffffffffffffe < sVar2 + sVar1)) {
    memset(pcVar3,0,__n);
  }
  if (bVar5) {
    pcVar4 = strrchr(original_name,0x2f);
    if (pcVar4 == (char *)0x0) {
      *pcVar3 = '\0';
    }
    else {
      strncpy(pcVar3,original_name,(size_t)(pcVar4 + (1 - (long)original_name)));
      pcVar3[(long)(pcVar4 + (1 - (long)original_name))] = '\0';
      original_name = pcVar4 + 1;
    }
    strcat(pcVar3,insertion);
    pcVar3 = strcat(pcVar3,original_name);
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

static char*
  raccess_make_file_name( FT_Memory    memory,
                          const char  *original_name,
                          const char  *insertion )
  {
    char*        new_name = NULL;
    const char*  tmp;
    const char*  slash;
    size_t       new_length;
    FT_Error     error = FT_Err_Ok;

    FT_UNUSED( error );


    new_length = ft_strlen( original_name ) + ft_strlen( insertion );
    if ( FT_ALLOC( new_name, new_length + 1 ) )
      return NULL;

    tmp = ft_strrchr( original_name, '/' );
    if ( tmp )
    {
      ft_strncpy( new_name,
                  original_name,
                  (size_t)( tmp - original_name + 1 ) );
      new_name[tmp - original_name + 1] = '\0';
      slash = tmp + 1;
    }
    else
    {
      slash       = original_name;
      new_name[0] = '\0';
    }

    ft_strcat( new_name, insertion );
    ft_strcat( new_name, slash );

    return new_name;
  }